

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

MessageOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(Arena *arena)

{
  MessageOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (MessageOptions *)operator_new(0x50);
    MessageOptions::MessageOptions(this);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&MessageOptions::typeinfo,0x50);
    }
    this = (MessageOptions *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x50);
    MessageOptions::MessageOptions(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}